

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::DoNode(internalJSONNode *parent,json_string *value_t)

{
  json_string *parent_00;
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  allocator<char> local_1f1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  json_string local_1c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  char *local_198;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined4 local_180;
  allocator local_179;
  json_string local_178;
  allocator<char> local_151;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  json_string local_128;
  size_t local_108;
  size_t name_starting;
  size_t value_ending;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined1 local_c8 [8];
  json_string name;
  json_string local_a0;
  size_t local_80;
  size_t name_ending;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  json_string *local_18;
  json_string *value_t_local;
  internalJSONNode *parent_local;
  
  local_18 = value_t;
  value_t_local = (json_string *)parent;
  bVar1 = std::__cxx11::string::empty();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"DoNode is empty",&local_39);
  JSONDebug::_JSON_ASSERT((bool)((bVar1 ^ 1) & 1),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar2 == '{') {
    uVar3 = std::__cxx11::string::length();
    if (2 < uVar3) {
      local_80 = FindNextRelevant<(char)58>(local_18,1);
      if (local_80 == 0xffffffffffffffff) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,"Missing :",(allocator *)(name.field_2._M_local_buf + 0xf));
        JSONDebug::_JSON_FAIL(&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        internalJSONNode::Nullify((internalJSONNode *)value_t_local);
      }
      else {
        local_d8._M_current = (char *)std::__cxx11::string::begin();
        local_d0 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_d8,1);
        local_f0._M_current = (char *)std::__cxx11::string::begin();
        local_e8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_f0,local_80);
        local_e0 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_e8,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)local_c8,local_d0,local_e0,(allocator<char> *)((long)&value_ending + 7)
                  );
        std::allocator<char>::~allocator((allocator<char> *)((long)&value_ending + 7));
        name_starting = FindNextRelevant<(char)44>(local_18,local_80);
        local_108 = 1;
        while (parent_00 = value_t_local, name_starting != 0xffffffffffffffff) {
          local_140._M_current = (char *)std::__cxx11::string::begin();
          local_138 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_140,local_80);
          local_130 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_138,1);
          local_150._M_current = (char *)std::__cxx11::string::begin();
          local_148 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_150,name_starting);
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)&local_128,local_130,local_148,&local_151);
          NewNode((internalJSONNode *)parent_00,(json_string *)local_c8,&local_128,false);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator(&local_151);
          local_108 = name_starting + 1;
          local_80 = FindNextRelevant<(char)58>(local_18,local_108);
          if (local_80 == 0xffffffffffffffff) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_178,"Missing :",&local_179);
            JSONDebug::_JSON_FAIL(&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator((allocator<char> *)&local_179);
            internalJSONNode::Nullify((internalJSONNode *)value_t_local);
            local_180 = 1;
            goto LAB_0012c387;
          }
          local_190._M_current = (char *)std::__cxx11::string::begin();
          local_188 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_190,local_108);
          local_1a8._M_current = (char *)std::__cxx11::string::begin();
          local_1a0 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_1a8,local_80);
          local_198 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_1a0,1);
          std::__cxx11::string::
          assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)local_c8,local_188,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_198);
          name_starting = FindNextRelevant<(char)44>(local_18,local_80);
        }
        local_1e0._M_current = (char *)std::__cxx11::string::begin();
        local_1d8 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_1e0,local_80);
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_1d8,1);
        local_1f0._M_current = (char *)std::__cxx11::string::end();
        local_1e8 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_1f0,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&local_1c8,local_1d0,local_1e8,&local_1f1);
        NewNode((internalJSONNode *)parent_00,(json_string *)local_c8,&local_1c8,false);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1f1);
        local_180 = 0;
LAB_0012c387:
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"DoNode is not an node",(allocator *)((long)&name_ending + 7));
    JSONDebug::_JSON_FAIL(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&name_ending + 7));
    internalJSONNode::Nullify((internalJSONNode *)value_t_local);
  }
  return;
}

Assistant:

void JSONWorker::DoNode(const internalJSONNode * parent, const json_string & value_t) json_nothrow {	
	//This take a node and creates its members and such
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoNode is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('{'), JSON_TEXT("DoNode is not an node"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a {} (blank node)
	
	size_t name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, 1);  //find where the name ends
	JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
	json_string name(value_t.begin() + 1, value_t.begin() + name_ending - 1);	  //pull the name out
	for (size_t value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending),  //find the end of the value
		 name_starting = 1;  //ignore the {
		 value_ending != json_string::npos;
		 value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending)){
		
		NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.begin() + value_ending), false);
		name_starting = value_ending + 1;
		name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, name_starting);
		JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
		name.assign(value_t.begin() + name_starting, value_t.begin() + name_ending - 1);
	}
	//since the last one will not find the comma, we have to add it here
	NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.end() - 1), false);
}